

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperFloatingPointEQ<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  floating_point<double> *in_RCX;
  string local_d0;
  string local_b0;
  string local_80;
  string local_60;
  floating_point<double> local_40;
  floating_point<double> f2;
  floating_point<double> f1;
  double val2_local;
  double val1_local;
  char *expr2_local;
  char *expr1_local;
  
  floating_point<double>::floating_point(&f2,val1);
  floating_point<double>::floating_point(&local_40,val2);
  bVar1 = floating_point<double>::AlmostEquals(&f2,&local_40);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<iutest::floating_point<double>,iutest::floating_point<double>>
              (&local_80,(internal *)&f2,&local_40,in_RCX);
    detail::ShowStringQuoted(&local_60,&local_80);
    FormatForComparisonFailureMessage<iutest::floating_point<double>,iutest::floating_point<double>>
              (&local_d0,(internal *)&local_40,&f2,in_RCX);
    detail::ShowStringQuoted(&local_b0,&local_d0);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_60,&local_b0,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointEQ(const char* expr1, const char* expr2
                                                , RawType val1, RawType val2)
{
    floating_point<RawType> f1(val1), f2(val2);
    if IUTEST_COND_LIKELY( f1.AlmostEquals(f2) )
    {
        return AssertionSuccess();
    }